

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase62::run(TestCase62 *this)

{
  bool bVar1;
  MessageSize MVar2;
  int local_17c;
  Builder local_178;
  Orphanage local_160;
  Orphan<capnproto_test::capnp::test::TestEmptyStruct> orphan;
  Builder root;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            (&root,&builder.super_MessageBuilder);
  local_178.builder.segment = root._builder.segment;
  local_178.builder.capTable = root._builder.capTable;
  local_178.builder.pointer = root._builder.pointers;
  bVar1 = AnyPointer::Builder::isNull(&local_178);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x42,ERROR,"\"failed: expected \" \"anyPointer.isNull()\"",
               (char (*) [37])"failed: expected anyPointer.isNull()");
  }
  AnyPointer::Builder::initAs<capnproto_test::capnp::test::TestAllTypes>
            ((BuilderFor<capnproto_test::capnp::test::TestAllTypes> *)&orphan,&local_178);
  local_160 = MessageBuilder::getOrphanage(&builder.super_MessageBuilder);
  Orphanage::newOrphan<capnproto_test::capnp::test::TestEmptyStruct>(&orphan,&local_160);
  AnyPointer::Builder::adopt<capnproto_test::capnp::test::TestEmptyStruct>(&local_178,&orphan);
  MVar2 = AnyPointer::Builder::targetSize(&local_178);
  if ((MVar2.wordCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_17c = 0;
    MVar2 = AnyPointer::Builder::targetSize(&local_178);
    local_160._0_12_ = MVar2._0_12_;
    kj::_::Debug::log<char_const(&)[60],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x46,ERROR,
               "\"failed: expected \" \"(0) == (anyPointer.targetSize().wordCount)\", 0, anyPointer.targetSize().wordCount"
               ,(char (*) [60])"failed: expected (0) == (anyPointer.targetSize().wordCount)",
               &local_17c,(unsigned_long *)&local_160);
  }
  bVar1 = AnyPointer::Builder::isNull(&local_178);
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x47,ERROR,"\"failed: expected \" \"!(anyPointer.isNull())\"",
               (char (*) [40])"failed: expected !(anyPointer.isNull())");
  }
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, EmptyStructOverwrite) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();
  auto anyPointer = root.getAnyPointerField();
  EXPECT_TRUE(anyPointer.isNull());
  anyPointer.initAs<TestAllTypes>();
  auto orphan = builder.getOrphanage().newOrphan<test::TestEmptyStruct>();
  anyPointer.adopt(kj::mv(orphan));
  EXPECT_EQ(0, anyPointer.targetSize().wordCount);
  EXPECT_FALSE(anyPointer.isNull());
}